

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O0

void __thiscall
testing::internal::ExpectationBase::UntypedTimes(ExpectationBase *this,Cardinality *a_cardinality)

{
  Clause CVar1;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  Cardinality *local_18;
  Cardinality *a_cardinality_local;
  ExpectationBase *this_local;
  
  local_18 = a_cardinality;
  a_cardinality_local = (Cardinality *)this;
  if (this->last_clause_ == kTimes) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_38,".Times() cannot appear more than once in an EXPECT_CALL().",
               &local_39);
    ExpectSpecProperty(this,false,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  else {
    CVar1 = this->last_clause_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_70,
               ".Times() cannot appear after .InSequence(), .WillOnce(), .WillRepeatedly(), or .RetiresOnSaturation()."
               ,&local_71);
    ExpectSpecProperty(this,(int)CVar1 < 2,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  this->last_clause_ = kTimes;
  SpecifyCardinality(this,local_18);
  return;
}

Assistant:

void ExpectationBase::UntypedTimes(const Cardinality& a_cardinality) {
  if (last_clause_ == kTimes) {
    ExpectSpecProperty(false,
                       ".Times() cannot appear "
                       "more than once in an EXPECT_CALL().");
  } else {
    ExpectSpecProperty(last_clause_ < kTimes,
                       ".Times() cannot appear after "
                       ".InSequence(), .WillOnce(), .WillRepeatedly(), "
                       "or .RetiresOnSaturation().");
  }
  last_clause_ = kTimes;

  SpecifyCardinality(a_cardinality);
}